

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::~SPxSolverBase(SPxSolverBase<double> *this)

{
  (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray =
       (_func_int **)&PTR__SPxSolverBase_0053d380;
  (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray =
       (_func_int **)&PTR__SPxSolverBase_0053d840;
  (this->super_SPxBasisBase<double>)._vptr_SPxBasisBase = (_func_int **)&DAT_0053d860;
  if (this->freePricer == true) {
    if (this->thepricer != (SPxPricer<double> *)0x0) {
      (*this->thepricer->_vptr_SPxPricer[0x15])();
    }
    this->thepricer = (SPxPricer<double> *)0x0;
  }
  if (this->freeRatioTester == true) {
    if (this->theratiotester != (SPxRatioTester<double> *)0x0) {
      (*this->theratiotester->_vptr_SPxRatioTester[0xb])();
    }
    this->theratiotester = (SPxRatioTester<double> *)0x0;
  }
  if (this->freeStarter == true) {
    if (this->thestarter != (SPxStarter<double> *)0x0) {
      (*this->thestarter->_vptr_SPxStarter[1])();
    }
    this->thestarter = (SPxStarter<double> *)0x0;
  }
  (**this->theTime->_vptr_Timer)();
  (**this->multTimeSparse->_vptr_Timer)();
  (**this->multTimeFull->_vptr_Timer)();
  (**this->multTimeColwise->_vptr_Timer)();
  (**this->multTimeUnsetup->_vptr_Timer)();
  spx_free<soplex::Timer*>(&this->theTime);
  spx_free<soplex::Timer*>(&this->multTimeSparse);
  spx_free<soplex::Timer*>(&this->multTimeFull);
  spx_free<soplex::Timer*>(&this->multTimeColwise);
  spx_free<soplex::Timer*>(&this->multTimeUnsetup);
  DataArray<int>::~DataArray(&this->integerVariables);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->coWeights);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->weights);
  DataArray<int>::~DataArray(&this->isInfeasibleCo);
  DataArray<int>::~DataArray(&this->isInfeasible);
  DIdxSet::~DIdxSet(&this->updateViolsCo);
  DIdxSet::~DIdxSet(&this->updateViols);
  DIdxSet::~DIdxSet(&this->infeasibilitiesCo);
  DIdxSet::~DIdxSet(&this->infeasibilities);
  DSVectorBase<double>::~DSVectorBase(&this->dualFarkas);
  DSVectorBase<double>::~DSVectorBase(&this->primalRay);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->theTest);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->theCoTest);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->theLBbound);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->theUBbound);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->theLCbound);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->theUCbound);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->theLRbound);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->theURbound);
  UpdateVector<double>::~UpdateVector(&this->addVec);
  UpdateVector<double>::~UpdateVector(&this->dualVec);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->dualRhs);
  UpdateVector<double>::~UpdateVector(&this->primVec);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->primRhs);
  std::
  _Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>::
  ~_Vector_base((_Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                 *)&this->unitVecs);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::~DataArray(&this->oldBasisStatusCols);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::~DataArray(&this->oldBasisStatusRows);
  SPxBasisBase<double>::~SPxBasisBase(&this->super_SPxBasisBase<double>);
  SPxLPBase<double>::~SPxLPBase(&this->super_SPxLPBase<double>);
  return;
}

Assistant:

SPxSolverBase<R>::~SPxSolverBase()
   {
      assert(!freePricer || thepricer != nullptr);
      assert(!freeRatioTester || theratiotester != nullptr);
      assert(!freeStarter || thestarter != nullptr);

      if(freePricer)
      {
         delete thepricer;
         thepricer = nullptr;
      }

      if(freeRatioTester)
      {
         delete theratiotester;
         theratiotester = nullptr;
      }

      if(freeStarter)
      {
         delete thestarter;
         thestarter = nullptr;
      }

      // free the timers
      assert(theTime);
      assert(multTimeSparse);
      assert(multTimeFull);
      assert(multTimeColwise);
      assert(multTimeUnsetup);
      theTime->~Timer();
      multTimeSparse->~Timer();
      multTimeFull->~Timer();
      multTimeColwise->~Timer();
      multTimeUnsetup->~Timer();
      spx_free(theTime);
      spx_free(multTimeSparse);
      spx_free(multTimeFull);
      spx_free(multTimeColwise);
      spx_free(multTimeUnsetup);
   }